

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O0

BOOL Js::JavascriptArray::TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
               (RecyclableObject *arr,uint index,Var *element,ScriptContext *scriptContext,
               bool checkHasItem)

{
  bool bVar1;
  undefined4 local_30;
  bool checkHasItem_local;
  ScriptContext *scriptContext_local;
  Var *element_local;
  uint index_local;
  RecyclableObject *arr_local;
  
  bVar1 = VarIsWithoutES5Array<Js::TypedArrayBase>(arr);
  if (bVar1) {
    local_30 = TemplatedGetItem<Js::TypedArrayBase>
                         ((TypedArrayBase *)arr,index,element,scriptContext,checkHasItem);
  }
  else {
    local_30 = Js::JavascriptOperators::GetItem(arr,index,element,scriptContext);
  }
  return local_30;
}

Assistant:

static BOOL TryTemplatedGetItem(RecyclableObject* arr, P index, Var *element, ScriptContext *scriptContext, bool checkHasItem = true)
        {
            return VarIsWithoutES5Array<T>(arr) ? JavascriptArray::TemplatedGetItem(static_cast<T*>(arr), index, element, scriptContext, checkHasItem) :
                JavascriptOperators::GetItem(arr, index, element, scriptContext);
        }